

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_randomness(int N,void *pBuf)

{
  long lVar1;
  int iVar2;
  sqlite3_vfs *psVar3;
  long lVar4;
  uint uVar5;
  u32 uVar6;
  u32 uVar7;
  uint uVar8;
  u32 uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  u32 uVar15;
  uint uVar16;
  u32 uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  u32 uVar22;
  uint uVar23;
  uint uVar24;
  u32 uVar25;
  long in_FS_OFFSET;
  bool bVar26;
  u32 local_a4;
  u32 local_a0;
  int local_9c;
  sqlite3_mutex *local_98;
  u32 local_78;
  uint uStack_74;
  u32 uStack_70;
  uint auStack_6c [3];
  u32 uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    if (sqlite3Config.bCoreMutex != '\0') {
      local_98 = (*sqlite3Config.mutex.xMutexAlloc)(5);
      bVar26 = local_98 == (sqlite3_mutex *)0x0;
      if (bVar26) {
        if (pBuf == (void *)0x0 || N < 1) goto LAB_0011fe84;
LAB_0011fe95:
        if (sqlite3Prng.s[0] == 0) {
          uVar22 = 0;
          psVar3 = sqlite3_vfs_find((char *)0x0);
          sqlite3Prng.s[0] = 0x61707865;
          sqlite3Prng.s[1] = 0x3320646e;
          sqlite3Prng.s[2] = 0x79622d32;
          sqlite3Prng.s[3] = 0x6b206574;
          if (psVar3 == (sqlite3_vfs *)0x0) {
            sqlite3Prng.s[0xd] = 0;
            sqlite3Prng.s[0xe] = 0;
            sqlite3Prng.s[8] = 0;
            sqlite3Prng.s[9] = 0;
            sqlite3Prng.s[10] = 0;
            sqlite3Prng.s[0xb] = 0;
            sqlite3Prng.s[4] = 0;
            sqlite3Prng.s[5] = 0;
            sqlite3Prng.s[6] = 0;
            sqlite3Prng.s[7] = 0;
          }
          else if (sqlite3Config.iPrngSeed == 0) {
            (*psVar3->xRandomness)(psVar3,0x2c,(char *)(sqlite3Prng.s + 4));
            uVar22 = sqlite3Prng.s[0xc];
          }
          else {
            sqlite3Prng.s[9] = 0;
            sqlite3Prng.s[10] = 0;
            sqlite3Prng.s[0xb] = 0;
            sqlite3Prng.s[5] = 0;
            sqlite3Prng.s[6] = 0;
            sqlite3Prng.s[7] = 0;
            sqlite3Prng.s[8] = 0;
            sqlite3Prng.s[0xd] = 0;
            sqlite3Prng.s[0xe] = 0;
            sqlite3Prng.s[4] = sqlite3Config.iPrngSeed;
            uVar22 = 0;
          }
          sqlite3Prng.s[0xc] = 0;
          sqlite3Prng.n = '\0';
          sqlite3Prng.s[0xf] = uVar22;
        }
        uVar19 = (uint)sqlite3Prng.n;
        local_9c = N;
        if ((uint)sqlite3Prng.n < (uint)N) {
          do {
            if (sqlite3Prng.n != '\0') {
              memcpy(pBuf,sqlite3Prng.out,(ulong)sqlite3Prng.n);
              local_9c = local_9c - (uint)sqlite3Prng.n;
              pBuf = (void *)((long)pBuf + (ulong)(uint)sqlite3Prng.n);
            }
            sqlite3Prng.s[0xc] = sqlite3Prng.s[0xc] + 1;
            local_78 = sqlite3Prng.s[0];
            uStack_74 = sqlite3Prng.s[1];
            local_a0 = uStack_74;
            local_a4 = sqlite3Prng.s[9];
            uStack_60 = sqlite3Prng.s[6];
            uStack_70 = sqlite3Prng.s[2];
            uStack_5c = sqlite3Prng.s[7];
            auStack_6c[0] = sqlite3Prng.s[3];
            iVar2 = 10;
            auStack_6c[1] = sqlite3Prng.s[4];
            auStack_6c[2] = sqlite3Prng.s[5];
            uVar22 = sqlite3Prng.s[0xc];
            uVar7 = sqlite3Prng.s[0xd];
            uVar6 = sqlite3Prng.s[8];
            uVar15 = sqlite3Prng.s[0xe];
            uVar17 = sqlite3Prng.s[10];
            uVar25 = sqlite3Prng.s[0xf];
            uVar9 = sqlite3Prng.s[0xb];
            do {
              uVar19 = uVar22 ^ local_78 + auStack_6c[1];
              uVar20 = uVar19 << 0x10 | uVar19 >> 0x10;
              uVar5 = uVar6 + uVar20;
              uVar19 = auStack_6c[1] ^ uVar5;
              uVar19 = uVar19 << 0xc | uVar19 >> 0x14;
              uVar8 = local_78 + auStack_6c[1] + uVar19;
              uVar20 = uVar20 ^ uVar8;
              uVar21 = uVar20 << 8 | uVar20 >> 0x18;
              uVar5 = uVar5 + uVar21;
              uVar19 = uVar19 ^ uVar5;
              uVar10 = uVar19 << 7 | uVar19 >> 0x19;
              uVar19 = uVar7 ^ local_a0 + auStack_6c[2];
              uVar20 = uVar19 << 0x10 | uVar19 >> 0x10;
              local_a4 = local_a4 + uVar20;
              uVar19 = auStack_6c[2] ^ local_a4;
              uVar19 = uVar19 << 0xc | uVar19 >> 0x14;
              local_a0 = local_a0 + auStack_6c[2] + uVar19;
              uVar20 = uVar20 ^ local_a0;
              uVar20 = uVar20 << 8 | uVar20 >> 0x18;
              local_a4 = local_a4 + uVar20;
              uVar19 = uVar19 ^ local_a4;
              uVar19 = uVar19 << 7 | uVar19 >> 0x19;
              uVar12 = uVar15 ^ uStack_70 + uStack_60;
              uVar13 = uVar12 << 0x10 | uVar12 >> 0x10;
              uVar16 = uVar17 + uVar13;
              uVar12 = uStack_60 ^ uVar16;
              uVar12 = uVar12 << 0xc | uVar12 >> 0x14;
              uVar11 = uStack_70 + uStack_60 + uVar12;
              uVar13 = uVar13 ^ uVar11;
              uVar14 = uVar13 << 8 | uVar13 >> 0x18;
              uVar16 = uVar16 + uVar14;
              uVar12 = uVar12 ^ uVar16;
              uVar13 = uVar12 << 7 | uVar12 >> 0x19;
              uVar12 = uVar25 ^ auStack_6c[0] + uStack_5c;
              uVar24 = uVar12 << 0x10 | uVar12 >> 0x10;
              uVar12 = uVar9 + uVar24;
              uVar18 = uStack_5c ^ uVar12;
              uVar18 = uVar18 << 0xc | uVar18 >> 0x14;
              uVar23 = auStack_6c[0] + uStack_5c + uVar18;
              uVar24 = uVar24 ^ uVar23;
              uVar24 = uVar24 << 8 | uVar24 >> 0x18;
              uVar12 = uVar12 + uVar24;
              uVar18 = uVar18 ^ uVar12;
              uVar18 = uVar18 << 7 | uVar18 >> 0x19;
              uVar8 = uVar8 + uVar19;
              uVar24 = uVar24 ^ uVar8;
              uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
              uVar16 = uVar16 + uVar24;
              uVar19 = uVar19 ^ uVar16;
              uVar19 = uVar19 << 0xc | uVar19 >> 0x14;
              local_78 = uVar8 + uVar19;
              uVar24 = uVar24 ^ local_78;
              uVar25 = uVar24 << 8 | uVar24 >> 0x18;
              uVar17 = uVar16 + uVar25;
              uVar19 = uVar19 ^ uVar17;
              auStack_6c[2] = uVar19 << 7 | uVar19 >> 0x19;
              local_a0 = local_a0 + uVar13;
              uVar21 = uVar21 ^ local_a0;
              uVar8 = uVar21 << 0x10 | uVar21 >> 0x10;
              uVar12 = uVar12 + uVar8;
              uVar13 = uVar13 ^ uVar12;
              uVar19 = uVar13 << 0xc | uVar13 >> 0x14;
              local_a0 = local_a0 + uVar19;
              uVar8 = uVar8 ^ local_a0;
              uVar22 = uVar8 << 8 | uVar8 >> 0x18;
              uVar9 = uVar12 + uVar22;
              uVar19 = uVar19 ^ uVar9;
              uStack_60 = uVar19 << 7 | uVar19 >> 0x19;
              uVar11 = uVar11 + uVar18;
              uVar20 = uVar20 ^ uVar11;
              uVar19 = uVar20 << 0x10 | uVar20 >> 0x10;
              uVar5 = uVar5 + uVar19;
              uVar18 = uVar18 ^ uVar5;
              uVar20 = uVar18 << 0xc | uVar18 >> 0x14;
              uStack_70 = uVar11 + uVar20;
              uVar19 = uVar19 ^ uStack_70;
              uVar7 = uVar19 << 8 | uVar19 >> 0x18;
              uVar6 = uVar5 + uVar7;
              uVar20 = uVar20 ^ uVar6;
              uStack_5c = uVar20 << 7 | uVar20 >> 0x19;
              uVar23 = uVar23 + uVar10;
              uVar14 = uVar14 ^ uVar23;
              uVar5 = uVar14 << 0x10 | uVar14 >> 0x10;
              local_a4 = local_a4 + uVar5;
              uVar10 = uVar10 ^ local_a4;
              uVar19 = uVar10 << 0xc | uVar10 >> 0x14;
              auStack_6c[0] = uVar23 + uVar19;
              uVar5 = uVar5 ^ auStack_6c[0];
              uVar15 = uVar5 << 8 | uVar5 >> 0x18;
              local_a4 = local_a4 + uVar15;
              uVar19 = uVar19 ^ local_a4;
              auStack_6c[1] = uVar19 << 7 | uVar19 >> 0x19;
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
            _local_78 = CONCAT44(local_a0,local_78);
            _local_48 = CONCAT44(uVar7,uVar22);
            _local_58 = CONCAT44(local_a4,uVar6);
            _uStack_40 = CONCAT44(uVar25,uVar15);
            _uStack_50 = CONCAT44(uVar9,uVar17);
            lVar4 = 0;
            do {
              uVar22 = sqlite3Prng.s[lVar4 + 1];
              uVar7 = sqlite3Prng.s[lVar4 + 2];
              uVar6 = sqlite3Prng.s[lVar4 + 3];
              uVar19 = (&uStack_74)[lVar4];
              uVar5 = auStack_6c[lVar4 + -1];
              uVar20 = auStack_6c[lVar4];
              lVar1 = lVar4 * 4;
              *(u32 *)(sqlite3Prng.out + lVar1) = sqlite3Prng.s[lVar4] + (&local_78)[lVar4];
              *(u32 *)(sqlite3Prng.out + lVar1 + 4) = uVar22 + uVar19;
              *(u32 *)(sqlite3Prng.out + lVar1 + 8) = uVar7 + uVar5;
              *(u32 *)(sqlite3Prng.out + lVar1 + 0xc) = uVar6 + uVar20;
              lVar4 = lVar4 + 4;
            } while (lVar4 != 0x10);
            sqlite3Prng.n = '@';
          } while (0x40 < local_9c);
          uVar19 = 0x40;
          N = local_9c;
        }
        memcpy(pBuf,sqlite3Prng.out + (int)(uVar19 - N),(long)N);
        sqlite3Prng.n = sqlite3Prng.n - (char)N;
        if (bVar26) goto LAB_0011fdea;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(local_98);
        if (pBuf != (void *)0x0 && 0 < N) {
          bVar26 = false;
          goto LAB_0011fe95;
        }
        sqlite3Prng.s._0_8_ = sqlite3Prng.s._0_8_ & 0xffffffff00000000;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (*sqlite3Config.mutex.xMutexLeave)(local_98);
        return;
      }
      goto LAB_00120264;
    }
    if (0 < N && pBuf != (void *)0x0) {
      bVar26 = true;
      local_98 = (sqlite3_mutex *)0x0;
      goto LAB_0011fe95;
    }
LAB_0011fe84:
    sqlite3Prng.s._0_8_ = sqlite3Prng.s._0_8_ & 0xffffffff00000000;
  }
LAB_0011fdea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00120264:
  __stack_chk_fail();
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.s[0] = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.
  */
  if( wsdPrng.s[0]==0 ){
    sqlite3_vfs *pVfs = sqlite3_vfs_find(0);
    static const u32 chacha20_init[] = {
      0x61707865, 0x3320646e, 0x79622d32, 0x6b206574
    };
    memcpy(&wsdPrng.s[0], chacha20_init, 16);
    if( NEVER(pVfs==0) ){
      memset(&wsdPrng.s[4], 0, 44);
    }else{
      sqlite3OsRandomness(pVfs, 44, (char*)&wsdPrng.s[4]);
    }
    wsdPrng.s[15] = wsdPrng.s[12];
    wsdPrng.s[12] = 0;
    wsdPrng.n = 0;
  }

  assert( N>0 );
  while( 1 /* exit by break */ ){
    if( N<=wsdPrng.n ){
      memcpy(zBuf, &wsdPrng.out[wsdPrng.n-N], N);
      wsdPrng.n -= N;
      break;
    }
    if( wsdPrng.n>0 ){
      memcpy(zBuf, wsdPrng.out, wsdPrng.n);
      N -= wsdPrng.n;
      zBuf += wsdPrng.n;
    }
    wsdPrng.s[12]++;
    chacha_block((u32*)wsdPrng.out, wsdPrng.s);
    wsdPrng.n = 64;
  }
  sqlite3_mutex_leave(mutex);
}